

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-double-page-size.cc
# Opt level: O0

void doubleBoxSize(QPDFPageObjectHelper *page,char *box_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  byte bVar1;
  bool bVar2;
  runtime_error *this;
  double dVar3;
  QPDFObjectHandle local_1a8;
  allocator<char> local_191;
  string local_190 [32];
  QPDFObjectHandle local_170;
  value_type local_160;
  undefined8 local_150;
  T *item;
  iterator __end1;
  iterator __begin1;
  QPDFArrayItems *__range1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> doubled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_60;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  QPDFObjectHandle box;
  char *box_name_local;
  QPDFPageObjectHelper *page_local;
  
  box.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)box_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,box_name,&local_49);
  QPDFPageObjectHelper::getAttribute((string *)local_28,SUB81(page,0));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = QPDFObjectHandle::isNull();
  if ((bVar1 & 1) == 0) {
    bVar1 = QPDFObjectHandle::isRectangle();
    if ((bVar1 & 1) == 0) {
      doubled.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"box ",
                 (allocator<char> *)
                 ((long)&doubled.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::operator+(&local_a0,&local_c0,
                     (char *)box.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
      std::operator+(&local_80,&local_a0," is not an array of four elements");
      std::runtime_error::runtime_error(this,(string *)&local_80);
      doubled.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range1);
    QPDFObjectHandle::aitems();
    QPDFObjectHandle::QPDFArrayItems::begin();
    QPDFObjectHandle::QPDFArrayItems::end();
    while( true ) {
      bVar2 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                        ((iterator *)
                         &__end1.ivalue.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         (iterator *)&item);
      if (!bVar2) break;
      local_150 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*
                            ((iterator *)
                             &__end1.ivalue.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                            );
      dVar3 = (double)QPDFObjectHandle::getNumericValue();
      QPDFObjectHandle::newReal(dVar3 + dVar3,(int)&local_160,true);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range1,&local_160
                );
      QPDFObjectHandle::~QPDFObjectHandle(&local_160);
      QPDFObjectHandle::QPDFArrayItems::iterator::operator++
                ((iterator *)
                 &__end1.ivalue.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    local_60 = 2;
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&item);
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator
              ((iterator *)
               &__end1.ivalue.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems
              ((QPDFArrayItems *)
               &__begin1.ivalue.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&local_170);
    __s = box.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_190,(char *)__s._M_pi,&local_191);
    QPDFObjectHandle::newArray((vector *)&local_1a8);
    QPDFObjectHandle::replaceKey((string *)&local_170,(QPDFObjectHandle *)local_190);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
    QPDFObjectHandle::~QPDFObjectHandle(&local_170);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__range1);
    local_60 = 0;
  }
  else {
    local_60 = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

static void
doubleBoxSize(QPDFPageObjectHelper& page, char const* box_name)
{
    // We need to use getAttribute rather than getKey as some boxes could be inherited.
    auto box = page.getAttribute(box_name, true);
    if (box.isNull()) {
        return;
    }
    if (!box.isRectangle()) {
        throw std::runtime_error(
            std::string("box ") + box_name + " is not an array of four elements");
    }
    std::vector<QPDFObjectHandle> doubled;
    for (auto& item: box.aitems()) {
        doubled.push_back(QPDFObjectHandle::newReal(item.getNumericValue() * 2.0, 2));
    }
    page.getObjectHandle().replaceKey(box_name, QPDFObjectHandle::newArray(doubled));
}